

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O0

float plutovg_font_face_text_extents
                (plutovg_font_face_t *face,float size,void *text,int length,
                plutovg_text_encoding_t encoding,plutovg_rect_t *extents)

{
  _Bool _Var1;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float y2;
  float x2;
  float y1;
  float x1;
  plutovg_rect_t glyph_extents;
  float advance_width;
  plutovg_codepoint_t codepoint;
  float total_advance_width;
  plutovg_rect_t *text_extents;
  plutovg_text_iterator_t it;
  plutovg_rect_t *extents_local;
  plutovg_text_encoding_t encoding_local;
  int length_local;
  void *text_local;
  float size_local;
  plutovg_font_face_t *face_local;
  
  it._16_8_ = extents;
  plutovg_text_iterator_init((plutovg_text_iterator_t *)&text_extents,text,length,encoding);
  _codepoint = (float *)0x0;
  advance_width = 0.0;
  while (_Var1 = plutovg_text_iterator_has_next((plutovg_text_iterator_t *)&text_extents), _Var1) {
    glyph_extents.h = (float)plutovg_text_iterator_next((plutovg_text_iterator_t *)&text_extents);
    if (it._16_8_ == 0) {
      plutovg_font_face_get_glyph_metrics
                (face,size,(plutovg_codepoint_t)glyph_extents.h,&glyph_extents.w,(float *)0x0,
                 (plutovg_rect_t *)0x0);
      advance_width = glyph_extents.w + advance_width;
    }
    else {
      plutovg_font_face_get_glyph_metrics
                (face,size,(plutovg_codepoint_t)glyph_extents.h,&glyph_extents.w,(float *)0x0,
                 (plutovg_rect_t *)&y1);
      y1 = advance_width + y1;
      advance_width = glyph_extents.w + advance_width;
      if (_codepoint == (float *)0x0) {
        _codepoint = (float *)it._16_8_;
        *(ulong *)it._16_8_ = CONCAT44(x1,y1);
        *(ulong *)(it._16_8_ + 8) = CONCAT44(glyph_extents.y,glyph_extents.x);
      }
      else {
        local_80 = y1;
        if (*_codepoint < y1) {
          local_80 = *_codepoint;
        }
        if (x1 <= _codepoint[1]) {
          local_84 = x1;
        }
        else {
          local_84 = _codepoint[1];
        }
        if (*_codepoint + _codepoint[2] <= y1 + glyph_extents.x) {
          local_88 = y1 + glyph_extents.x;
        }
        else {
          local_88 = *_codepoint + _codepoint[2];
        }
        if (_codepoint[1] + _codepoint[3] <= x1 + glyph_extents.y) {
          local_8c = x1 + glyph_extents.y;
        }
        else {
          local_8c = _codepoint[1] + _codepoint[3];
        }
        *_codepoint = local_80;
        _codepoint[1] = local_84;
        _codepoint[2] = local_88 - local_80;
        _codepoint[3] = local_8c - local_84;
      }
    }
  }
  if ((it._16_8_ != 0) && (_codepoint == (float *)0x0)) {
    *(undefined4 *)it._16_8_ = 0;
    *(undefined4 *)(it._16_8_ + 4) = 0;
    *(undefined4 *)(it._16_8_ + 8) = 0;
    *(undefined4 *)(it._16_8_ + 0xc) = 0;
  }
  return advance_width;
}

Assistant:

float plutovg_font_face_text_extents(plutovg_font_face_t* face, float size, const void* text, int length, plutovg_text_encoding_t encoding, plutovg_rect_t* extents)
{
    plutovg_text_iterator_t it;
    plutovg_text_iterator_init(&it, text, length, encoding);
    plutovg_rect_t* text_extents = NULL;
    float total_advance_width = 0.f;
    while(plutovg_text_iterator_has_next(&it)) {
        plutovg_codepoint_t codepoint = plutovg_text_iterator_next(&it);

        float advance_width;
        if(extents == NULL) {
            plutovg_font_face_get_glyph_metrics(face, size, codepoint, &advance_width, NULL, NULL);
            total_advance_width += advance_width;
            continue;
        }

        plutovg_rect_t glyph_extents;
        plutovg_font_face_get_glyph_metrics(face, size, codepoint, &advance_width, NULL, &glyph_extents);

        glyph_extents.x += total_advance_width;
        total_advance_width += advance_width;
        if(text_extents == NULL) {
            text_extents = extents;
            *text_extents = glyph_extents;
            continue;
        }

        float x1 = plutovg_min(text_extents->x, glyph_extents.x);
        float y1 = plutovg_min(text_extents->y, glyph_extents.y);
        float x2 = plutovg_max(text_extents->x + text_extents->w, glyph_extents.x + glyph_extents.w);
        float y2 = plutovg_max(text_extents->y + text_extents->h, glyph_extents.y + glyph_extents.h);

        text_extents->x = x1;
        text_extents->y = y1;
        text_extents->w = x2 - x1;
        text_extents->h = y2 - y1;
    }

    if(extents && !text_extents) {
        extents->x = 0;
        extents->y = 0;
        extents->w = 0;
        extents->h = 0;
    }

    return total_advance_width;
}